

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O2

bool __thiscall
Rotate_BSpline_Segment::intersect(Rotate_BSpline_Segment *this,Ray *ray,Hit *h,float tmin)

{
  Vector3f *pVVar1;
  Vector3f *this_00;
  vector<double,_std::allocator<double>_> *__x;
  Vector3f *this_01;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  double *u;
  float *pfVar10;
  pointer pdVar11;
  double *u_1;
  double *pdVar12;
  double *pdVar13;
  double *u_2;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float t_00;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double local_2a8;
  vector<double,_std::allocator<double>_> x;
  Vector3f pxx;
  vector<double,_std::allocator<double>_> z;
  vector<double,_std::allocator<double>_> t;
  Vector3f local_1e4;
  vector<double,_std::allocator<double>_> f;
  vector<double,_std::allocator<double>_> oo;
  Vector3f pxx_1;
  Vector3f pyy_1;
  Vector3f pyy;
  _Vector_base<double,_std::allocator<double>_> local_168;
  _Vector_base<double,_std::allocator<double>_> local_150;
  _Vector_base<double,_std::allocator<double>_> local_138;
  _Vector_base<double,_std::allocator<double>_> local_120;
  _Vector_base<double,_std::allocator<double>_> local_108;
  _Vector_base<double,_std::allocator<double>_> local_f0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 auVar32 [16];
  
  (*(this->super_Object)._vptr_Object[1])((BoundingBox *)&t,this);
  bVar9 = BoundingBox::intersect((BoundingBox *)&t,ray,tmin,h->t + 0.001);
  if (bVar9) {
    this_01 = &ray->d;
    pfVar10 = Vector3f::operator[](this_01,1);
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)*pfVar10),auVar14);
    if (1e-05 <= auVar14._0_4_) {
      operator-(&ray->o);
      pVVar1 = &this->o;
      operator+((Vector3f *)&x,pVVar1);
      pfVar10 = Vector3f::operator[]((Vector3f *)&t,1);
      fVar17 = *pfVar10;
      pfVar10 = Vector3f::operator[](this_01,1);
      fVar2 = *pfVar10;
      std::vector<double,_std::allocator<double>_>::vector(&t,&this->py);
      if (t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&t,(double *)&x);
      }
      *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)fVar17 +
                  *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      for (; t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
          t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = t.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) {
        *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = (double)(1.0 / fVar2) *
                    *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
      std::vector<double,_std::allocator<double>_>::vector(&x,&t);
      std::vector<double,_std::allocator<double>_>::vector(&z,&t);
      for (pdVar11 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar11 !=
          x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish; pdVar11 = pdVar11 + 1) {
        pfVar10 = Vector3f::operator[](this_01,0);
        *pdVar11 = (double)*pfVar10 * *pdVar11;
      }
      operator-(&ray->o,pVVar1);
      pfVar10 = Vector3f::operator[]((Vector3f *)&f,0);
      *x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)*pfVar10 +
                  *x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      for (pdVar11 = z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar11 !=
          z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish; pdVar11 = pdVar11 + 1) {
        pfVar10 = Vector3f::operator[](this_01,2);
        *pdVar11 = (double)*pfVar10 * *pdVar11;
      }
      operator-(&ray->o,pVVar1);
      pfVar10 = Vector3f::operator[]((Vector3f *)&f,2);
      *z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)*pfVar10 +
                  *z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_a8,&x);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_c0,&x);
      poly_mul<double>((vector<double,_std::allocator<double>_> *)&local_90,
                       (vector<double,_std::allocator<double>_> *)&local_a8,
                       (vector<double,_std::allocator<double>_> *)&local_c0);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_f0,&z);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_108,&z);
      poly_mul<double>((vector<double,_std::allocator<double>_> *)&local_d8,
                       (vector<double,_std::allocator<double>_> *)&local_f0,
                       (vector<double,_std::allocator<double>_> *)&local_108);
      poly_add<double>((vector<double,_std::allocator<double>_> *)&local_78,
                       (vector<double,_std::allocator<double>_> *)&local_90,
                       (vector<double,_std::allocator<double>_> *)&local_d8);
      __x = &this->px;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_138,__x);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_150,__x);
      poly_mul<double>((vector<double,_std::allocator<double>_> *)&local_120,
                       (vector<double,_std::allocator<double>_> *)&local_138,
                       (vector<double,_std::allocator<double>_> *)&local_150);
      poly_minus<double>(&f,(vector<double,_std::allocator<double>_> *)&local_78,
                         (vector<double,_std::allocator<double>_> *)&local_120);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_120);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_150);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_138);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_168,&f);
      Poly_Solver::poly_solve
                (&oo,(vector<double,_std::allocator<double>_> *)&local_168,this->l,this->r,1e-11);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_168);
      bVar9 = false;
      for (pdVar11 = oo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar11 !=
          oo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish; pdVar11 = pdVar11 + 1) {
        dVar22 = *pdVar11;
        if ((this->l <= dVar22) && (dVar22 <= this->r)) {
          dVar18 = poly_calc(&this->py,dVar22);
          dVar18 = (dVar18 + (double)fVar17) * (double)(1.0 / fVar2);
          if (((double)tmin <= dVar18) && (dVar18 < (double)h->t)) {
            dVar19 = poly_calc(__x,dVar22);
            t_00 = (float)dVar18;
            Ray::pos((Ray *)&pxx,t_00);
            operator-(&pxx,pVVar1);
            pfVar10 = Vector3f::operator[](&pyy,0);
            fVar3 = *pfVar10;
            pfVar10 = Vector3f::operator[](&pyy,0);
            fVar16 = *pfVar10;
            pfVar10 = Vector3f::operator[](&pyy,2);
            fVar4 = *pfVar10;
            pfVar10 = Vector3f::operator[](&pyy,2);
            auVar14 = vfmadd132ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)(fVar4 * *pfVar10)),
                                      ZEXT416((uint)fVar3));
            auVar25._0_8_ = (double)auVar14._0_4_;
            auVar25._8_8_ = auVar14._8_8_;
            auVar8._8_8_ = extraout_XMM0_Qb_00;
            auVar8._0_8_ = dVar19;
            auVar14 = vfnmadd213sd_fma(auVar8,auVar8,auVar25);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0x7fffffffffffffff;
            auVar15._12_4_ = 0x7fffffff;
            auVar14 = vandpd_avx512vl(auVar14,auVar15);
            if (auVar14._0_8_ <= 0.0001) {
              h->t = t_00;
              h->obj = &this->super_Object;
              ::operator*(&pxx_1,t_00);
              operator+(&ray->o,&pxx_1);
              operator-(&pyy_1,pVVar1);
              Vector3f::Vector3f(&pyy_1,0.0,1.0,0.0);
              pfVar10 = Vector3f::operator[](&pxx,0);
              fVar3 = *pfVar10;
              pfVar10 = Vector3f::operator[](&pxx,2);
              Vector3f::Vector3f(&local_1e4,fVar3,0.0,*pfVar10);
              Vector3f::normalized(&local_1e4);
              dVar18 = poly_calc(&this->nx,dVar22);
              ::operator*(&local_48,(float)dVar18);
              dVar22 = poly_calc(&this->ny,dVar22);
              ::operator*(&local_3c,(float)dVar22);
              operator+(&local_48,&local_3c);
              Vector3f::operator=(&h->norm,&local_1e4);
              Vector3f::normalize(&h->norm);
              Vector2f::operator=(&h->pos,&Vector2f::ZERO);
              bVar9 = true;
            }
          }
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&oo.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&f.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&z.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&x.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&t.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector(&t,&this->py);
      if (t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&t,(double *)&x);
      }
      pVVar1 = &this->o;
      operator-(pVVar1,&ray->o);
      pfVar10 = Vector3f::operator[]((Vector3f *)&x,1);
      *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)*pfVar10 +
                  *t.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,&t);
      Poly_Solver::poly_solve
                (&x,(vector<double,_std::allocator<double>_> *)&local_60,this->l,this->r,1e-07);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      bVar9 = false;
      this_00 = &h->norm;
      for (pdVar11 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar11 !=
          x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish; pdVar11 = pdVar11 + 1) {
        dVar22 = *pdVar11;
        if ((this->l <= dVar22) && (dVar22 <= this->r)) {
          pfVar10 = Vector3f::operator[](this_01,0);
          dVar18 = (double)*pfVar10;
          operator-(&ray->o,pVVar1);
          pfVar10 = Vector3f::operator[]((Vector3f *)&z,0);
          fVar17 = *pfVar10;
          pfVar10 = Vector3f::operator[](this_01,2);
          dVar19 = (double)*pfVar10;
          operator-(&ray->o,pVVar1);
          pfVar10 = Vector3f::operator[]((Vector3f *)&z,2);
          dVar20 = (double)*pfVar10;
          dVar21 = poly_calc(&this->px,dVar22);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar18;
          z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = (double)fVar17;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar19 * dVar19;
          auVar14 = vfmadd231sd_fma(auVar32,auVar26,auVar26);
          dVar31 = auVar14._0_8_;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar18 + dVar18;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = (dVar19 + dVar19) * dVar20;
          auVar14 = vfmadd231sd_fma(auVar30,auVar29,auVar27);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar20 * dVar20;
          auVar15 = vfmadd231sd_fma(auVar28,auVar29,auVar29);
          z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar31 * -4.0 * (auVar15._0_8_ - dVar21 * dVar21);
          auVar15 = vfmadd231sd_fma(auVar23,auVar14,auVar14);
          dVar18 = auVar15._0_8_;
          if (dVar18 < 0.0) {
            pdVar12 = (double *)0x0;
            pdVar13 = (double *)0x0;
          }
          else {
            if (dVar18 < 0.0) {
              dVar18 = sqrt(dVar18);
            }
            else {
              auVar15 = vsqrtsd_avx(auVar15,auVar15);
              dVar18 = auVar15._0_8_;
            }
            auVar6._12_4_ = 0x80000000;
            auVar6._0_12_ = ZEXT812(0x8000000000000000);
            auVar15 = vxorpd_avx512vl(auVar14,auVar6);
            f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((auVar15._0_8_ - dVar18) / (dVar31 + dVar31));
            std::vector<double,_std::allocator<double>_>::emplace_back<double>(&z,(double *)&f);
            local_2a8 = auVar14._0_8_;
            f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((dVar18 - local_2a8) / (dVar31 + dVar31));
            std::vector<double,_std::allocator<double>_>::emplace_back<double>(&z,(double *)&f);
            pdVar12 = z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pdVar13 = z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          for (; pdVar13 != pdVar12; pdVar13 = pdVar13 + 1) {
            dVar18 = *pdVar13;
            if (((double)tmin <= dVar18) && (dVar18 < (double)h->t)) {
              dVar19 = poly_calc(&this->px,dVar22);
              fVar16 = (float)dVar18;
              Ray::pos((Ray *)&oo,fVar16);
              operator-((Vector3f *)&oo,pVVar1);
              pfVar10 = Vector3f::operator[]((Vector3f *)&f,0);
              fVar17 = *pfVar10;
              pfVar10 = Vector3f::operator[]((Vector3f *)&f,0);
              fVar2 = *pfVar10;
              pfVar10 = Vector3f::operator[]((Vector3f *)&f,2);
              fVar3 = *pfVar10;
              pfVar10 = Vector3f::operator[]((Vector3f *)&f,2);
              auVar14 = vfmadd132ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(fVar3 * *pfVar10)),
                                        ZEXT416((uint)fVar17));
              auVar24._0_8_ = (double)auVar14._0_4_;
              auVar24._8_8_ = auVar14._8_8_;
              auVar7._8_8_ = extraout_XMM0_Qb;
              auVar7._0_8_ = dVar19;
              auVar14 = vfnmadd213sd_fma(auVar7,auVar7,auVar24);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0x7fffffffffffffff;
              auVar5._12_4_ = 0x7fffffff;
              auVar14 = vandpd_avx512vl(auVar14,auVar5);
              if (auVar14._0_8_ <= 0.001) {
                h->t = fVar16;
                h->obj = &this->super_Object;
                ::operator*(&pxx,fVar16);
                operator+(&ray->o,&pxx);
                operator-(&pyy,pVVar1);
                Vector3f::Vector3f(&pyy,0.0,1.0,0.0);
                pfVar10 = Vector3f::operator[]((Vector3f *)&oo,0);
                fVar17 = *pfVar10;
                pfVar10 = Vector3f::operator[]((Vector3f *)&oo,2);
                Vector3f::Vector3f(&pyy_1,fVar17,0.0,*pfVar10);
                Vector3f::normalized(&pyy_1);
                dVar18 = poly_calc(&this->nx,dVar22);
                ::operator*(&pxx_1,(float)dVar18);
                dVar18 = poly_calc(&this->ny,dVar22);
                ::operator*(&local_1e4,(float)dVar18);
                operator+(&pxx_1,&local_1e4);
                Vector3f::operator=(this_00,&pyy_1);
                Vector3f::normalize(this_00);
                operator-(this_01);
                fVar17 = Vector3f::dot(this_00,&pyy_1);
                if (fVar17 < 0.0) {
                  operator-(this_00);
                  Vector3f::operator=(this_00,&pyy_1);
                }
                Vector2f::operator=(&h->pos,&Vector2f::ZERO);
                bVar9 = true;
              }
            }
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&z.super__Vector_base<double,_std::allocator<double>_>);
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&x.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&t.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool intersect(const Ray& ray, Hit& h, float tmin) override {
		if (!this->getBound().intersect(ray, tmin, h.t + 1e-3)) return 0;
		//(ray.o+ray.d*t-o)_y=py(u)
		//((ray.o+ray.d*t-o)_x)^2+((ray.o+ray.d*t-o)_z)^2-px(u)^2=0
		//t=(py(u)+Y(-ray.o+o))/Y(ray.d)
		if (fabs(ray.d[1]) < 1e-5) { //almost pararrel
			//py(u)=(ray.o-o)_y
			std::vector<double> f = py;
			if (!f.size()) f.push_back(0);
			f[0]+=(o - ray.o)[1];
			std::vector<double> oo = poly_solve(f, l, r, 1e-7);
			bool suc = 0;
			for (auto u : oo) {
				if (u<l || u>r) continue;
				double k1 = ray.d[0], b1 = (ray.o - o)[0], k2 = ray.d[2], b2 = (ray.o - o)[2], b=poly_calc(px,u);
				b = -b * b;
				//(k1*t+b1)^2+(k2*t+b2)^2+b=0
				double A = k1 * k1 + k2 * k2, B = 2 * k1 * b1 + 2 * k2 * b2, C = b1 * b1 + b2 * b2 + b;
				std::vector<double> og;
				double dt = B * B - 4 * A * C;
				if (dt >= 0) {
					dt = sqrt(dt);
					og.push_back((-B - dt) / (2 * A));
					og.push_back((-B + dt) / (2 * A));
				}
				for(auto g:og)
				if (g >= tmin && g < h.t) {
					double gx = poly_calc(px, u);
					Vector3f f = ray.pos(g) - o;
					double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
					if (fabs(l) > 1e-3) continue;
					h.t = g; h.obj = this;
					Vector3f pos = ray.o + ray.d * h.t - o,
						pyy = Vector3f(0, 1, 0),
						pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//					double X = poly_calc(px, u), Y = poly_calc(py, u);
//					cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
					h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
					h.norm.normalize();
					if (Vector3f::dot(h.norm, -ray.d) < 0) h.norm = -h.norm;
					//todo: add pos, too lazy atm
					h.pos = Vector2f::ZERO; suc = 1;
				}
			}
			return suc;
		}
		float b1 = (-ray.o + o)[1], k1 = 1.0 / ray.d[1];
		//t=(py(u)+b1)*k1
		std::vector<double> t = py;
		if (!t.size()) t.push_back(0);
		t[0] += b1;
		for (auto& u : t) u *= k1;
		std::vector<double> x = t, z = t;
		for (auto& u : x) u *= ray.d[0];
		x[0] += (ray.o - o)[0];
		for (auto& u : z) u *= ray.d[2];
		z[0] += (ray.o - o)[2];
		std::vector<double> f = poly_minus(poly_add(poly_mul(x, x), poly_mul(z, z)), poly_mul(px, px));
		std::vector<double> oo = poly_solve(f, l, r, 1e-11);
//		std::cerr << "good!" << f.size() << "w" << oo.size() << "!";
//		for (auto c : oo) std::cerr << c << "|"<<poly_calc(px,c)<<"|"<<poly_calc(f,c)<<","; std::cerr << "\n";
		bool suc = 0;
		for (auto u : oo) {
			if (u<l || u>r) continue;
			double g = poly_calc(py, u);
			g = (g + b1) * k1;
			if (g >= tmin && g < h.t) {
				double gx = poly_calc(px, u);
				Vector3f f = ray.pos(g) - o;
				double l = f[0] * f[0] + f[2] * f[2]; l -= gx * gx;
				if (fabs(l) > 1e-4) continue;
				h.t = g; h.obj = this;
				Vector3f pos = ray.o + ray.d * h.t - o,
					pyy = Vector3f(0, 1, 0),
					pxx = Vector3f(pos[0], 0, pos[2]).normalized();
//				double X = poly_calc(px, u), Y = poly_calc(py, u);
//				cerr << g << "," << u << "|" << X * X << "," << pos[0] * pos[0] + pos[2] * pos[2] << "|" << Y << "," << pos[1] << "\n";
//				cerr<<pos[1]<<" "<<pos[0]*pos[0]+pos[2]*pos[2]<<"  "<<poly_calc(px,u)<<" "<<
				h.norm = pxx * poly_calc(nx, u) + pyy * poly_calc(ny, u);
				h.norm.normalize();
				//if (Vector3f::dot(h.norm, -ray.d)<0) h.norm = -h.norm;
				//todo: add pos, too lazy atm
				h.pos = Vector2f::ZERO; suc = 1;
			}
		}
		return suc;
	}